

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-fds.c
# Opt level: O0

int sanity_assert_no_wsi_traces(lws_context *context,lws *wsi)

{
  lws **pplVar1;
  bool bVar2;
  lws **done;
  lws **p;
  lws *wsi_local;
  lws_context *context_local;
  
  if ((*(ushort *)&context->field_0x7b7 >> 10 & 1) != 0) {
    done = context->lws_lookup;
    pplVar1 = done + context->max_fds;
    while( true ) {
      bVar2 = false;
      if (done != pplVar1) {
        bVar2 = *done != wsi;
      }
      if (!bVar2) break;
      done = done + 1;
    }
    if (done != pplVar1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/plat/unix/unix-fds.c"
                    ,0x4b,
                    "int sanity_assert_no_wsi_traces(const struct lws_context *, struct lws *)");
    }
  }
  return 0;
}

Assistant:

int
sanity_assert_no_wsi_traces(const struct lws_context *context, struct lws *wsi)
{
	struct lws **p, **done;

	if (!context->max_fds_unrelated_to_ulimit)
		/* can't tell */
		return 0;

	/* slow fds handling */

	p = context->lws_lookup;
	done = &p[context->max_fds];

	/* confirm the wsi doesn't already exist */

	while (p != done && *p != wsi)
		p++;

	if (p == done)
		return 0;

	assert(0); /* this wsi is still mentioned inside lws */

	return 1;
}